

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall Session::resetOp(Session *this)

{
  CryptoFactory *pCVar1;
  SymmetricAlgorithm **ppSVar2;
  
  if (this->param != (void *)0x0) {
    free(this->param);
    this->param = (void *)0x0;
    this->paramLen = 0;
  }
  if (this->digestOp == (HashAlgorithm *)0x0) {
    if (this->findOp == (FindOperation *)0x0) {
      if (this->asymmetricCryptoOp == (AsymmetricAlgorithm *)0x0) {
        if (this->symmetricCryptoOp == (SymmetricAlgorithm *)0x0) {
          if (this->macOp == (MacAlgorithm *)0x0) goto LAB_0016f8e5;
          ppSVar2 = (SymmetricAlgorithm **)&this->macOp;
          if (this->symmetricKey != (SymmetricKey *)0x0) {
            (*this->macOp->_vptr_MacAlgorithm[10])();
            this->symmetricKey = (SymmetricKey *)0x0;
          }
          pCVar1 = CryptoFactory::i();
          (*pCVar1->_vptr_CryptoFactory[7])(pCVar1,(MacAlgorithm *)*ppSVar2);
        }
        else {
          ppSVar2 = &this->symmetricCryptoOp;
          if (this->symmetricKey != (SymmetricKey *)0x0) {
            (*this->symmetricCryptoOp->_vptr_SymmetricAlgorithm[10])();
            this->symmetricKey = (SymmetricKey *)0x0;
          }
          pCVar1 = CryptoFactory::i();
          (*pCVar1->_vptr_CryptoFactory[1])(pCVar1,*ppSVar2);
        }
      }
      else {
        if (this->publicKey != (PublicKey *)0x0) {
          (*this->asymmetricCryptoOp->_vptr_AsymmetricAlgorithm[0x1a])();
          this->publicKey = (PublicKey *)0x0;
        }
        ppSVar2 = (SymmetricAlgorithm **)&this->asymmetricCryptoOp;
        if (this->privateKey != (PrivateKey *)0x0) {
          (*this->asymmetricCryptoOp->_vptr_AsymmetricAlgorithm[0x1b])();
          this->privateKey = (PrivateKey *)0x0;
        }
        pCVar1 = CryptoFactory::i();
        (*pCVar1->_vptr_CryptoFactory[3])(pCVar1,(AsymmetricAlgorithm *)*ppSVar2);
      }
    }
    else {
      ppSVar2 = (SymmetricAlgorithm **)&this->findOp;
      FindOperation::recycle(this->findOp);
    }
  }
  else {
    ppSVar2 = (SymmetricAlgorithm **)&this->digestOp;
    pCVar1 = CryptoFactory::i();
    (*pCVar1->_vptr_CryptoFactory[5])(pCVar1,(HashAlgorithm *)*ppSVar2);
  }
  *ppSVar2 = (SymmetricAlgorithm *)0x0;
LAB_0016f8e5:
  this->operation = 0;
  this->reAuthentication = false;
  return;
}

Assistant:

void Session::resetOp()
{
	if (param != NULL)
	{
		free(param);
		param = NULL;
		paramLen = 0;
	}

	if (digestOp != NULL)
	{
		CryptoFactory::i()->recycleHashAlgorithm(digestOp);
		digestOp = NULL;
	}
	else if (findOp != NULL)
	{
		findOp->recycle();
		findOp = NULL;
	}
	else if (asymmetricCryptoOp != NULL)
	{
		if (publicKey != NULL)
		{
			asymmetricCryptoOp->recyclePublicKey(publicKey);
			publicKey = NULL;
		}
		if (privateKey != NULL)
		{
			asymmetricCryptoOp->recyclePrivateKey(privateKey);
			privateKey = NULL;
		}
		CryptoFactory::i()->recycleAsymmetricAlgorithm(asymmetricCryptoOp);
		asymmetricCryptoOp = NULL;
	}
	else if (symmetricCryptoOp != NULL)
	{
		if (symmetricKey != NULL)
		{
			symmetricCryptoOp->recycleKey(symmetricKey);
			symmetricKey = NULL;
		}
		CryptoFactory::i()->recycleSymmetricAlgorithm(symmetricCryptoOp);
		symmetricCryptoOp = NULL;
	}
	else if (macOp != NULL)
	{
		if (symmetricKey != NULL)
		{
			macOp->recycleKey(symmetricKey);
			symmetricKey = NULL;
		}
		CryptoFactory::i()->recycleMacAlgorithm(macOp);
		macOp = NULL;
	}

	operation = SESSION_OP_NONE;
	reAuthentication = false;
}